

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsharedpointer_impl.h
# Opt level: O0

QSharedPointer<char> * __thiscall
QSharedPointer<char>::operator=(QSharedPointer<char> *this,QSharedPointer<char> *other)

{
  QSharedPointer<char> *in_RDI;
  long in_FS_OFFSET;
  QSharedPointer<char> copy;
  QSharedPointer<char> *this_00;
  QSharedPointer<char> local_18;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_18.value.ptr = (char *)0xaaaaaaaaaaaaaaaa;
  local_18.d = (Data *)0xaaaaaaaaaaaaaaaa;
  this_00 = &local_18;
  QSharedPointer(this_00,in_RDI);
  swap(this_00,in_RDI);
  ~QSharedPointer((QSharedPointer<char> *)0x1ee111);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

QSharedPointer &operator=(const QSharedPointer &other) noexcept
    {
        QSharedPointer copy(other);
        swap(copy);
        return *this;
    }